

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QString * __thiscall QFileDialog::labelText(QFileDialog *this,DialogLabel label)

{
  bool bVar1;
  AcceptMode AVar2;
  QFileDialogPrivate *this_00;
  QPushButton *pQVar3;
  undefined4 in_EDX;
  QFileDialogPrivate *in_RDI;
  QPushButton *button;
  QFileDialogPrivate *d;
  QFileDialogPrivate *this_01;
  StandardButton which;
  StandardButton which_00;
  
  this_01 = in_RDI;
  this_00 = d_func((QFileDialog *)0x7596f2);
  bVar1 = QFileDialogPrivate::usingWidgets(in_RDI);
  if (!bVar1) {
    QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x759716);
    QFileDialogOptions::labelText((DialogLabel)in_RDI);
    return (QString *)this_01;
  }
  which_00 = 0xaaaaaaaa;
  which = 0xaaaaaaaa;
  switch(in_EDX) {
  case 0:
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&this_00->qFileDialogUi);
    QLabel::text((QLabel *)this_01);
    return (QString *)this_01;
  case 1:
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&this_00->qFileDialogUi);
    QLabel::text((QLabel *)this_01);
    return (QString *)this_01;
  case 2:
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&this_00->qFileDialogUi);
    QLabel::text((QLabel *)this_01);
    return (QString *)this_01;
  case 3:
    AVar2 = acceptMode((QFileDialog *)in_RDI);
    if (AVar2 == AcceptOpen) {
      QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                (&this_00->qFileDialogUi);
      pQVar3 = QDialogButtonBox::button((QDialogButtonBox *)this_00,which_00);
    }
    else {
      QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                (&this_00->qFileDialogUi);
      pQVar3 = QDialogButtonBox::button((QDialogButtonBox *)this_00,which_00);
    }
    if (pQVar3 != (QPushButton *)0x0) {
      QAbstractButton::text((QAbstractButton *)this_01);
      return (QString *)this_01;
    }
    break;
  case 4:
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&this_00->qFileDialogUi);
    pQVar3 = QDialogButtonBox::button((QDialogButtonBox *)this_00,which);
    if (pQVar3 != (QPushButton *)0x0) {
      QAbstractButton::text((QAbstractButton *)this_01);
      return (QString *)this_01;
    }
  }
  QString::QString((QString *)0x75989a);
  return (QString *)this_01;
}

Assistant:

QString QFileDialog::labelText(DialogLabel label) const
{
    Q_D(const QFileDialog);
    if (!d->usingWidgets())
        return d->options->labelText(static_cast<QFileDialogOptions::DialogLabel>(label));
    QPushButton *button;
    switch (label) {
    case LookIn:
        return d->qFileDialogUi->lookInLabel->text();
    case FileName:
        return d->qFileDialogUi->fileNameLabel->text();
    case FileType:
        return d->qFileDialogUi->fileTypeLabel->text();
    case Accept:
        if (acceptMode() == AcceptOpen)
            button = d->qFileDialogUi->buttonBox->button(QDialogButtonBox::Open);
        else
            button = d->qFileDialogUi->buttonBox->button(QDialogButtonBox::Save);
        if (button)
            return button->text();
        break;
    case Reject:
        button = d->qFileDialogUi->buttonBox->button(QDialogButtonBox::Cancel);
        if (button)
            return button->text();
        break;
    }
    return QString();
}